

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O1

ssize_t __thiscall r_comp::Metadata::write(Metadata *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  Class *pCVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pbVar5;
  void *__buf_00;
  long lVar6;
  undefined4 in_register_00000034;
  int *piVar7;
  size_t sVar8;
  long lVar9;
  _Hash_node_base *p_Var10;
  pointer i;
  
  piVar7 = (int *)CONCAT44(in_register_00000034,__fd);
  *piVar7 = (int)((ulong)((long)(this->classes_by_opcodes).m_vector.
                                super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->classes_by_opcodes).m_vector.
                               super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  if ((this->classes_by_opcodes).m_vector.
      super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->classes_by_opcodes).m_vector.
      super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar6 = 1;
  }
  else {
    lVar6 = 1;
    sVar8 = 0;
    do {
      pCVar2 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,sVar8);
      Class::write(pCVar2,__fd + (int)lVar6 * 4,__buf_00,__n);
      pCVar2 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,sVar8);
      sVar3 = Class::get_size(pCVar2);
      lVar6 = lVar6 + sVar3;
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)(((long)(this->classes_by_opcodes).m_vector.
                                    super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->classes_by_opcodes).m_vector.
                                    super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x71c71c71c71c71c7));
  }
  piVar7[lVar6] = (int)(this->classes)._M_h._M_element_count;
  for (p_Var10 = (this->classes)._M_h._M_before_begin._M_nxt; lVar9 = lVar6 + 1,
      p_Var10 != (_Hash_node_base *)0x0; p_Var10 = p_Var10->_M_nxt) {
    r_code::WriteString((uint *)(piVar7 + lVar9),(string *)(p_Var10 + 1));
    lVar6 = r_code::GetStringSize((string *)(p_Var10 + 1));
    lVar6 = lVar6 + lVar9;
    uVar1 = r_code::Atom::asOpcode();
    piVar7[lVar6] = (uint)uVar1;
  }
  lVar6 = lVar6 + 2;
  piVar7[lVar9] = (int)(this->sys_classes)._M_h._M_element_count;
  for (p_Var10 = (this->sys_classes)._M_h._M_before_begin._M_nxt; p_Var10 != (_Hash_node_base *)0x0;
      p_Var10 = p_Var10->_M_nxt) {
    r_code::WriteString((uint *)(piVar7 + lVar6),(string *)(p_Var10 + 1));
    lVar9 = r_code::GetStringSize((string *)(p_Var10 + 1));
    uVar1 = r_code::Atom::asOpcode();
    piVar7[lVar9 + lVar6] = (uint)uVar1;
    lVar6 = lVar6 + lVar9 + 1;
  }
  piVar7[lVar6] =
       (int)((ulong)((long)(this->class_names).m_vector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->class_names).m_vector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  lVar6 = lVar6 + 1;
  if ((this->class_names).m_vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->class_names).m_vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar8 = 0;
    do {
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->class_names,sVar8);
      r_code::WriteString((uint *)(piVar7 + lVar6),(string *)pbVar4);
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->class_names,sVar8);
      lVar9 = r_code::GetStringSize((string *)pbVar4);
      lVar6 = lVar6 + lVar9;
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)((long)(this->class_names).m_vector.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->class_names).m_vector.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  piVar7[lVar6] =
       (int)((ulong)((long)(this->operator_names).m_vector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->operator_names).m_vector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  lVar6 = lVar6 + 1;
  if ((this->operator_names).m_vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->operator_names).m_vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar8 = 0;
    do {
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->operator_names,sVar8);
      r_code::WriteString((uint *)(piVar7 + lVar6),(string *)pbVar4);
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->operator_names,sVar8);
      lVar9 = r_code::GetStringSize((string *)pbVar4);
      lVar6 = lVar6 + lVar9;
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)((long)(this->operator_names).m_vector.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->operator_names).m_vector.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  piVar7[lVar6] =
       (int)((ulong)((long)(this->function_names).m_vector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->function_names).m_vector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  pbVar5 = (this->function_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != (this->function_names).m_vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = lVar6 + 1;
    i = (pointer)0x0;
    do {
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->function_names,(size_t)i);
      r_code::WriteString((uint *)(piVar7 + lVar6),(string *)pbVar4);
      pbVar4 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->function_names,(size_t)i);
      lVar9 = r_code::GetStringSize((string *)pbVar4);
      lVar6 = lVar6 + lVar9;
      i = (pointer)((long)&(i->_M_dataplus)._M_p + 1);
      pbVar5 = (pointer)((long)(this->function_names).m_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->function_names).m_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (i < pbVar5);
  }
  return (ssize_t)pbVar5;
}

Assistant:

void Metadata::write(uint32_t *data)
{
    data[0] = classes_by_opcodes.size();
    size_t i;
    size_t offset = 1;

    for (i = 0; i < classes_by_opcodes.size(); ++i) {
        classes_by_opcodes[i].write(data + offset);
        offset += classes_by_opcodes[i].get_size();
    }

    data[offset++] = classes.size();
    std::unordered_map<std::string, Class>::iterator it = classes.begin();

    for (; it != classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = sys_classes.size();
    it = sys_classes.begin();

    for (; it != sys_classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = class_names.size();

    for (i = 0; i < class_names.size(); ++i) {
        r_code::WriteString(data + offset, class_names[i]);
        offset += r_code::GetStringSize(class_names[i]);
    }

    data[offset++] = operator_names.size();

    for (i = 0; i < operator_names.size(); ++i) {
        r_code::WriteString(data + offset, operator_names[i]);
        offset += r_code::GetStringSize(operator_names[i]);
    }

    data[offset++] = function_names.size();

    for (i = 0; i < function_names.size(); ++i) {
        r_code::WriteString(data + offset, function_names[i]);
        offset += r_code::GetStringSize(function_names[i]);
    }
}